

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.cpp
# Opt level: O0

ssize_t __thiscall LayoutFile::write(LayoutFile *this,int __fd,void *__buf,size_t __n)

{
  uint uVar1;
  void *__ptr;
  undefined4 in_register_00000034;
  string local_38 [4];
  uint len;
  string xml;
  FILE *f_local;
  LayoutFile *this_local;
  
  if (this->root != (Widget *)0x0) {
    (**this->root->_vptr_Widget)(local_38,this->root,0);
    uVar1 = std::__cxx11::string::length();
    __ptr = (void *)std::__cxx11::string::c_str();
    fwrite(__ptr,1,(ulong)uVar1,(FILE *)CONCAT44(in_register_00000034,__fd));
    fflush((FILE *)CONCAT44(in_register_00000034,__fd));
    this = (LayoutFile *)std::__cxx11::string::~string(local_38);
  }
  return (ssize_t)this;
}

Assistant:

void LayoutFile::write(FILE *f)
{
	if (root == nullptr)
		return;
	std::string xml = root->writeXml(0);
	unsigned int len = xml.length();
	fwrite(xml.c_str(), sizeof(char), len, f);
	fflush(f);
}